

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flat_file.c
# Opt level: O1

ion_status_t flat_file_delete(ion_flat_file_t *flat_file,ion_key_t key)

{
  bool bVar1;
  ulong location;
  byte bVar2;
  byte bVar3;
  uint uVar4;
  ion_status_t iVar5;
  ulong location_00;
  byte bVar6;
  long lVar7;
  ion_fpos_t loc;
  ion_flat_file_row_t last_row;
  ion_flat_file_row_t row;
  ulong local_88;
  ion_key_t local_80;
  ion_flat_file_row_t local_78;
  ion_flat_file_row_t local_60;
  ion_flat_file_row_t local_48;
  
  iVar5.error = '\x14';
  iVar5._1_3_ = 0;
  iVar5.count = 0;
  if (flat_file->sorted_mode != '\0') {
    return iVar5;
  }
  local_88 = 0xffffffffffffffff;
  uVar4 = 0;
  local_80 = key;
  bVar6 = 0x12;
  do {
    bVar2 = flat_file_scan(flat_file,local_88,(ion_fpos_t *)&local_88,&local_48,'\x01',
                           flat_file_predicate_key_match,key);
    location = local_88;
    if (bVar2 != 0) {
      bVar3 = bVar2;
      if (bVar2 == 0xe) {
        bVar3 = 0;
      }
      bVar6 = 1;
      if (uVar4 != 0) {
        bVar6 = bVar3;
      }
      if (local_88 == 0xffffffffffffffff) {
        bVar3 = bVar6;
      }
      if (bVar2 == 0xe) {
        bVar3 = bVar6;
      }
      break;
    }
    lVar7 = flat_file->eof_position - flat_file->row_size;
    location_00 = (ulong)(lVar7 - flat_file->start_of_data) / flat_file->row_size;
    if (location_00 == local_88) {
LAB_00107b02:
      local_78.row_status = '\0';
      local_78._1_7_ = 0;
      local_78.key = (ion_key_t)0x0;
      local_78.value = (ion_value_t)0x0;
      bVar3 = flat_file_write_row(flat_file,location_00,&local_78);
      if (bVar3 == 0) {
        flat_file->eof_position = lVar7;
        uVar4 = uVar4 + 1;
        bVar1 = true;
        bVar3 = bVar6;
      }
      else {
LAB_00107b77:
        bVar1 = false;
      }
    }
    else {
      bVar3 = flat_file_read_row(flat_file,location_00,&local_60);
      if (bVar3 == 0) {
        bVar3 = flat_file_write_row(flat_file,location,&local_60);
        key = local_80;
        if (bVar3 == 0) goto LAB_00107b02;
        goto LAB_00107b77;
      }
      bVar1 = false;
      key = local_80;
    }
    bVar6 = bVar3;
  } while (bVar1);
  return (ion_status_t)((ulong)bVar3 | (ulong)uVar4 << 0x20);
}

Assistant:

ion_status_t
flat_file_delete(
	ion_flat_file_t *flat_file,
	ion_key_t		key
) {
	if (flat_file->sorted_mode) {
		return ION_STATUS_ERROR(err_sorted_order_violation);
	}

	ion_status_t		status	= ION_STATUS_INITIALIZE;
	ion_flat_file_row_t row;
	ion_err_t			err;
	ion_fpos_t			loc		= -1;

	while (err_ok == (err = flat_file_scan(flat_file, loc, &loc, &row, ION_FLAT_FILE_SCAN_FORWARDS, flat_file_predicate_key_match, key))) {
		ion_fpos_t			last_record_offset	= flat_file->eof_position - flat_file->row_size;
		ion_flat_file_row_t last_row;
		ion_fpos_t			last_record_index	= (last_record_offset - flat_file->start_of_data) / flat_file->row_size;
		ion_err_t			row_err;

		/* If the last index and the loc are the same, then we can just move the eof position. Saves a read/write. */
		if (last_record_index != loc) {
			row_err = flat_file_read_row(flat_file, last_record_index, &last_row);

			if (err_ok != row_err) {
				status.error = row_err;
				return status;
			}

			row_err = flat_file_write_row(flat_file, loc, &last_row);

			if (err_ok != row_err) {
				status.error = row_err;
				return status;
			}
		}

		/* Set last row to be empty just for sanity reasons. */
		row_err = flat_file_write_row(flat_file, last_record_index, &(ion_flat_file_row_t) { ION_FLAT_FILE_STATUS_EMPTY, NULL, NULL });

		if (err_ok != row_err) {
			status.error = row_err;
			return status;
		}

		/* Soft truncate the file by bumping the eof position back to cut off the last record. */
		flat_file->eof_position = last_record_offset;
		status.count++;

		/* No location movement is done here, since we need to check the row we just swapped in to see if it is
		   also a match. */
	}

	status.error = err_ok;

	if (((err == err_file_hit_eof) || (-1 == loc)) && (status.count == 0)) {
		status.error = err_item_not_found;
	}
	else if (err != err_file_hit_eof) {
		status.error = err;
	}

	return status;
}